

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O3

void glfwWindowHint(int hint,int value)

{
  if (_glfwInitialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    return;
  }
  switch(hint) {
  case 0x21001:
    _glfw.hints.framebuffer.redBits = value;
    return;
  case 0x21002:
    _glfw.hints.framebuffer.greenBits = value;
    return;
  case 0x21003:
    _glfw.hints.framebuffer.blueBits = value;
    return;
  case 0x21004:
    _glfw.hints.framebuffer.alphaBits = value;
    return;
  case 0x21005:
    _glfw.hints.framebuffer.depthBits = value;
    return;
  case 0x21006:
    _glfw.hints.framebuffer.stencilBits = value;
    return;
  case 0x21007:
    _glfw.hints.framebuffer.accumRedBits = value;
    return;
  case 0x21008:
    _glfw.hints.framebuffer.accumGreenBits = value;
    return;
  case 0x21009:
    _glfw.hints.framebuffer.accumBlueBits = value;
    return;
  case 0x2100a:
    _glfw.hints.framebuffer.accumAlphaBits = value;
    return;
  case 0x2100b:
    _glfw.hints.framebuffer.auxBuffers = value;
    return;
  case 0x2100c:
    _glfw.hints.framebuffer.stereo = (uint)(value != 0);
    return;
  case 0x2100d:
    _glfw.hints.framebuffer.samples = value;
    return;
  case 0x2100e:
    _glfw.hints.framebuffer.sRGB = (uint)(value != 0);
    return;
  case 0x2100f:
    _glfw.hints.refreshRate = value;
    return;
  case 0x21010:
    _glfw.hints.framebuffer.doublebuffer = (uint)(value != 0);
    return;
  }
  switch(hint) {
  case 0x22001:
    _glfw.hints.context.client = value;
    return;
  case 0x22002:
    _glfw.hints.context.major = value;
    return;
  case 0x22003:
    _glfw.hints.context.minor = value;
    return;
  case 0x22004:
    goto switchD_00156517_caseD_22004;
  case 0x22005:
    _glfw.hints.context.robustness = value;
    return;
  case 0x22006:
    _glfw.hints.context.forward = (uint)(value != 0);
    return;
  case 0x22007:
    _glfw.hints.context.debug = (uint)(value != 0);
    return;
  case 0x22008:
    _glfw.hints.context.profile = value;
    return;
  case 0x22009:
    _glfw.hints.context.release = value;
    return;
  case 0x2200a:
    _glfw.hints.context.noerror = (uint)(value != 0);
    return;
  case 0x2200b:
    _glfw.hints.context.source = value;
    return;
  default:
    switch(hint) {
    case 0x20001:
      _glfw.hints.window.focused = (uint)(value != 0);
      return;
    case 0x20003:
      _glfw.hints.window.resizable = (uint)(value != 0);
      return;
    case 0x20004:
      _glfw.hints.window.visible = (uint)(value != 0);
      return;
    case 0x20005:
      _glfw.hints.window.decorated = (uint)(value != 0);
      return;
    case 0x20006:
      _glfw.hints.window.autoIconify = (uint)(value != 0);
      return;
    case 0x20007:
      _glfw.hints.window.floating = (uint)(value != 0);
      return;
    case 0x20008:
      _glfw.hints.window.maximized = (uint)(value != 0);
      return;
    }
switchD_00156517_caseD_22004:
    _glfwInputError(0x10003,"Invalid window hint %i");
    return;
  }
}

Assistant:

GLFWAPI void glfwWindowHint(int hint, int value)
{
    _GLFW_REQUIRE_INIT();

    switch (hint)
    {
        case GLFW_RED_BITS:
            _glfw.hints.framebuffer.redBits = value;
            break;
        case GLFW_GREEN_BITS:
            _glfw.hints.framebuffer.greenBits = value;
            break;
        case GLFW_BLUE_BITS:
            _glfw.hints.framebuffer.blueBits = value;
            break;
        case GLFW_ALPHA_BITS:
            _glfw.hints.framebuffer.alphaBits = value;
            break;
        case GLFW_DEPTH_BITS:
            _glfw.hints.framebuffer.depthBits = value;
            break;
        case GLFW_STENCIL_BITS:
            _glfw.hints.framebuffer.stencilBits = value;
            break;
        case GLFW_ACCUM_RED_BITS:
            _glfw.hints.framebuffer.accumRedBits = value;
            break;
        case GLFW_ACCUM_GREEN_BITS:
            _glfw.hints.framebuffer.accumGreenBits = value;
            break;
        case GLFW_ACCUM_BLUE_BITS:
            _glfw.hints.framebuffer.accumBlueBits = value;
            break;
        case GLFW_ACCUM_ALPHA_BITS:
            _glfw.hints.framebuffer.accumAlphaBits = value;
            break;
        case GLFW_AUX_BUFFERS:
            _glfw.hints.framebuffer.auxBuffers = value;
            break;
        case GLFW_STEREO:
            _glfw.hints.framebuffer.stereo = value ? GLFW_TRUE : GLFW_FALSE;
            break;
        case GLFW_DOUBLEBUFFER:
            _glfw.hints.framebuffer.doublebuffer = value ? GLFW_TRUE : GLFW_FALSE;
            break;
        case GLFW_SAMPLES:
            _glfw.hints.framebuffer.samples = value;
            break;
        case GLFW_SRGB_CAPABLE:
            _glfw.hints.framebuffer.sRGB = value ? GLFW_TRUE : GLFW_FALSE;
            break;
        case GLFW_RESIZABLE:
            _glfw.hints.window.resizable = value ? GLFW_TRUE : GLFW_FALSE;
            break;
        case GLFW_DECORATED:
            _glfw.hints.window.decorated = value ? GLFW_TRUE : GLFW_FALSE;
            break;
        case GLFW_FOCUSED:
            _glfw.hints.window.focused = value ? GLFW_TRUE : GLFW_FALSE;
            break;
        case GLFW_AUTO_ICONIFY:
            _glfw.hints.window.autoIconify = value ? GLFW_TRUE : GLFW_FALSE;
            break;
        case GLFW_FLOATING:
            _glfw.hints.window.floating = value ? GLFW_TRUE : GLFW_FALSE;
            break;
        case GLFW_MAXIMIZED:
            _glfw.hints.window.maximized = value ? GLFW_TRUE : GLFW_FALSE;
            break;
        case GLFW_VISIBLE:
            _glfw.hints.window.visible = value ? GLFW_TRUE : GLFW_FALSE;
            break;
        case GLFW_CLIENT_API:
            _glfw.hints.context.client = value;
            break;
        case GLFW_CONTEXT_CREATION_API:
            _glfw.hints.context.source = value;
            break;
        case GLFW_CONTEXT_VERSION_MAJOR:
            _glfw.hints.context.major = value;
            break;
        case GLFW_CONTEXT_VERSION_MINOR:
            _glfw.hints.context.minor = value;
            break;
        case GLFW_CONTEXT_ROBUSTNESS:
            _glfw.hints.context.robustness = value;
            break;
        case GLFW_OPENGL_FORWARD_COMPAT:
            _glfw.hints.context.forward = value ? GLFW_TRUE : GLFW_FALSE;
            break;
        case GLFW_OPENGL_DEBUG_CONTEXT:
            _glfw.hints.context.debug = value ? GLFW_TRUE : GLFW_FALSE;
            break;
        case GLFW_CONTEXT_NO_ERROR:
            _glfw.hints.context.noerror = value ? GLFW_TRUE : GLFW_FALSE;
            break;
        case GLFW_OPENGL_PROFILE:
            _glfw.hints.context.profile = value;
            break;
        case GLFW_CONTEXT_RELEASE_BEHAVIOR:
            _glfw.hints.context.release = value;
            break;
        case GLFW_REFRESH_RATE:
            _glfw.hints.refreshRate = value;
            break;
        default:
            _glfwInputError(GLFW_INVALID_ENUM, "Invalid window hint %i", hint);
            break;
    }
}